

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

void __thiscall
AssemblyCode::MoveMemFromConstCommand::MoveMemFromConstCommand
          (MoveMemFromConstCommand *this,CTemp *target,int constant)

{
  int constant_local;
  CTemp *target_local;
  MoveMemFromConstCommand *this_local;
  
  AssemblyCommand::AssemblyCommand(&this->super_AssemblyCommand);
  (this->super_AssemblyCommand)._vptr_AssemblyCommand = (_func_int **)&PTR_GetIn_00239f28;
  IRT::CTemp::CTemp(&this->target,target);
  this->constant = constant;
  return;
}

Assistant:

AssemblyCode::MoveMemFromConstCommand::MoveMemFromConstCommand( const IRT::CTemp &target, int constant ) : target(
        target ), constant( constant ) { }